

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O0

Formula * Kernel::Formula::createLet(uint functor,VList *variables,TermList body,Formula *contents)

{
  TermList TVar1;
  Formula *pFVar2;
  TermList in_RDX;
  TermList in_RSI;
  undefined4 in_EDI;
  TermList letTerm;
  TermList contentsTerm;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  TermList *in_stack_ffffffffffffff90;
  Formula *in_stack_ffffffffffffffa0;
  VList *in_stack_ffffffffffffffb0;
  TermList in_stack_ffffffffffffffd0;
  undefined8 local_28;
  
  Term::createFormula(in_stack_ffffffffffffffa0);
  TermList::TermList(in_stack_ffffffffffffff90,
                     (Term *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  TVar1 = AtomicSort::boolSort();
  Term::createLet((uint)(TVar1._content >> 0x20),in_stack_ffffffffffffffb0,in_stack_ffffffffffffffd0
                  ,in_RDX,local_28);
  TermList::TermList((TermList *)in_RSI._content,(Term *)CONCAT44(in_EDI,in_stack_ffffffffffffff88))
  ;
  pFVar2 = (Formula *)BoolTermFormula::operator_new(0x857222);
  BoolTermFormula::BoolTermFormula
            ((BoolTermFormula *)CONCAT44(in_EDI,in_stack_ffffffffffffff88),in_RSI);
  return pFVar2;
}

Assistant:

Formula* Formula::createLet(unsigned functor, VList* variables, TermList body, Formula* contents)
{
  TermList contentsTerm(Term::createFormula(contents));
  TermList letTerm(Term::createLet(functor, variables, body, contentsTerm, AtomicSort::boolSort()));
  return new BoolTermFormula(letTerm);
}